

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

int __thiscall QBuffer::open(QBuffer *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EDX;
  ulong uVar2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (ulong)((uint)__file | 2);
  if (((ulong)__file & 0xc) == 0) {
    uVar2 = (ulong)__file & 0xffffffff;
  }
  if ((uVar2 & 3) == 0) {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning(&local_38,"QBuffer::open: Buffer access not specified");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return 0;
    }
  }
  else {
    if ((uVar2 & 8) != 0) {
      QByteArray::resize((QByteArray *)
                         (this->super_QIODevice).super_QObject.d_ptr.d[4].bindingStorage.
                         bindingStatus,0);
      __oflag = extraout_EDX;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar1 = QIODevice::open(&this->super_QIODevice,(char *)(ulong)((uint)uVar2 | 0x20),__oflag);
      return iVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QBuffer::open(OpenMode mode)
{
    Q_D(QBuffer);

    if ((mode & (Append | Truncate)) != 0)
        mode |= WriteOnly;
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QBuffer::open: Buffer access not specified");
        return false;
    }

    if ((mode & Truncate) == Truncate)
        d->buf->resize(0);

    return QIODevice::open(mode | QIODevice::Unbuffered);
}